

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

int32_t u_getIntPropertyValue_63(UChar32 c,UProperty which)

{
  UBool UVar1;
  byte bVar2;
  int32_t iVar3;
  IntProperty *prop_1;
  BinaryProperty *prop;
  UProperty which_local;
  UChar32 c_local;
  
  if (which < UCHAR_BIDI_CLASS) {
    if ((UCHAR_INVALID_CODE < which) && (which < UCHAR_BINARY_LIMIT)) {
      UVar1 = (*binProps[which].contains)(binProps + which,c,which);
      return (int)UVar1;
    }
  }
  else {
    if (which < UCHAR_INT_LIMIT) {
      iVar3 = (*intProps[which + 0xfffff000].getValue)(intProps + (which + 0xfffff000),c,which);
      return iVar3;
    }
    if (which == UCHAR_GENERAL_CATEGORY_MASK) {
      bVar2 = u_charType_63(c);
      return 1 << (bVar2 & 0x1f);
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_getIntPropertyValue(UChar32 c, UProperty which) {
    if(which<UCHAR_INT_START) {
        if(UCHAR_BINARY_START<=which && which<UCHAR_BINARY_LIMIT) {
            const BinaryProperty &prop=binProps[which];
            return prop.contains(prop, c, which);
        }
    } else if(which<UCHAR_INT_LIMIT) {
        const IntProperty &prop=intProps[which-UCHAR_INT_START];
        return prop.getValue(prop, c, which);
    } else if(which==UCHAR_GENERAL_CATEGORY_MASK) {
        return U_MASK(u_charType(c));
    }
    return 0;  // undefined
}